

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O3

expected<void,_std::error_code> * __thiscall
jaegertracing::Tracer::Inject
          (expected<void,_std::error_code> *__return_storage_ptr__,Tracer *this,SpanContext *ctx,
          HTTPHeadersWriter *writer)

{
  element_type *peVar1;
  error_category *peVar2;
  long lVar3;
  
  lVar3 = __dynamic_cast(ctx,&opentracing::v3::SpanContext::typeinfo,&SpanContext::typeinfo,0);
  peVar2 = DAT_0027c758;
  if (lVar3 == 0) {
    (__return_storage_ptr__->contained).m_error._M_value =
         opentracing::v3::invalid_span_context_error;
    (__return_storage_ptr__->contained).m_error._M_cat = peVar2;
  }
  else {
    peVar1 = (this->_httpHeaderPropagator).
             super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>)._vptr_Extractor[3])
              (peVar1,lVar3,writer);
  }
  __return_storage_ptr__->has_value_ = lVar3 != 0;
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void>
    Inject(const opentracing::SpanContext& ctx,
           const opentracing::HTTPHeadersWriter& writer) const override
    {
        const auto* jaegerCtx = dynamic_cast<const SpanContext*>(&ctx);
        if (!jaegerCtx) {
            return opentracing::make_expected_from_error<void>(
                opentracing::invalid_span_context_error);
        }
        _httpHeaderPropagator->inject(*jaegerCtx, writer);
        return opentracing::make_expected();
    }